

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<Behavior> __thiscall
cinject::InstanceStorage<Behavior,_cinject::FunctionFactory<Behavior>_>::createInstance
          (InstanceStorage<Behavior,_cinject::FunctionFactory<Behavior>_> *this,
          InjectionContext *context)

{
  pointer pcVar1;
  undefined8 uVar2;
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Behavior> sVar3;
  ContextGuard guard;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  char local_60 [16];
  ContextGuard local_50;
  
  pcVar1 = context[2].componentStack_.
           super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_98 = local_88;
  if (pcVar1 == (pointer)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"8Behavior","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,context[2].container_,
               (long)&(context[2].container_)->parentContainer_ + (long)pcVar1);
  }
  local_78 = (undefined1  [8])&Behavior::typeinfo;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_98,local_98 + local_90);
  ContextGuard::ContextGuard(&local_50,in_RDX,(component_type *)local_78);
  if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  ContextGuard::ensureNoCycle(&local_50);
  if ((context->componentStack_).
      super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)context[1].container_)(this,&context->componentStack_,&local_98);
    ContextGuard::~ContextGuard(&local_50);
    sVar3.super___shared_ptr<Behavior,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<Behavior,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Behavior>)sVar3.super___shared_ptr<Behavior,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar2 = std::__throw_bad_function_call();
  _Unwind_Resume(uVar2);
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }